

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-caps.c
# Opt level: O0

int lws_plat_user_colon_group_to_ids(char *u_colon_g,uid_t *puid,gid_t *pgid)

{
  int iVar1;
  group *pgVar2;
  passwd *ppVar3;
  int ulen;
  group *g;
  passwd *p;
  char u [33];
  char *colon;
  gid_t *pgid_local;
  uid_t *puid_local;
  char *u_colon_g_local;
  
  register0x00000000 = strchr(u_colon_g,0x3a);
  if (register0x00000000 == (char *)0x0) {
    u_colon_g_local._4_4_ = 1;
  }
  else {
    iVar1 = (int)register0x00000000 - (int)u_colon_g;
    if ((iVar1 < 2) || (0x20 < iVar1)) {
      u_colon_g_local._4_4_ = 1;
    }
    else {
      memcpy(&p,u_colon_g,(long)iVar1);
      u[(long)iVar1 + -8] = '\0';
      register0x00000000 = stack0xffffffffffffffd0 + 1;
      pgVar2 = getgrnam(register0x00000000);
      if (pgVar2 == (group *)0x0) {
        _lws_log(1,"%s: unknown group \'%s\'\n","lws_plat_user_colon_group_to_ids",
                 stack0xffffffffffffffd0);
        u_colon_g_local._4_4_ = 1;
      }
      else {
        *pgid = pgVar2->gr_gid;
        ppVar3 = getpwnam((char *)&p);
        if (ppVar3 == (passwd *)0x0) {
          _lws_log(1,"%s: unknown group \'%s\'\n","lws_plat_user_colon_group_to_ids",&p);
          u_colon_g_local._4_4_ = 1;
        }
        else {
          *puid = ppVar3->pw_uid;
          u_colon_g_local._4_4_ = 0;
        }
      }
    }
  }
  return u_colon_g_local._4_4_;
}

Assistant:

int
lws_plat_user_colon_group_to_ids(const char *u_colon_g, uid_t *puid, gid_t *pgid)
{
	char *colon = strchr(u_colon_g, ':'), u[33];
	struct passwd *p;
	struct group *g;
	int ulen;

	if (!colon)
		return 1;

	ulen = lws_ptr_diff(colon, u_colon_g);
	if (ulen < 2 || ulen > (int)sizeof(u) - 1)
		return 1;

	memcpy(u, u_colon_g, ulen);
	u[ulen] = '\0';

	colon++;

	g = getgrnam(colon);
	if (!g) {
		lwsl_err("%s: unknown group '%s'\n", __func__, colon);

		return 1;
	}
	*pgid = g->gr_gid;

	p = getpwnam(u);
	if (!p) {
		lwsl_err("%s: unknown group '%s'\n", __func__, u);

		return 1;
	}
	*puid = p->pw_uid;

	return 0;
}